

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

void __thiscall
de::Random::
shuffle<__gnu_cxx::__normal_iterator<__GLsync**,std::vector<__GLsync*,std::allocator<__GLsync*>>>>
          (Random *this,
          __normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_>
          first,__normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_>
                last)

{
  __GLsync *p_Var1;
  int iVar2;
  uint max;
  ulong uVar3;
  
  uVar3 = (ulong)((long)last._M_current - (long)first._M_current) >> 3 & 0xffffffff;
  while( true ) {
    uVar3 = uVar3 - 1;
    max = (uint)uVar3;
    if ((int)max < 1) break;
    iVar2 = getInt(this,0,max);
    p_Var1 = first._M_current[max & 0x7fffffff];
    first._M_current[max & 0x7fffffff] = first._M_current[iVar2];
    first._M_current[iVar2] = p_Var1;
  }
  return;
}

Assistant:

void Random::shuffle (Iterator first, Iterator last)
{
	using std::swap;

	// Fisher-Yates suffle
	int numItems = (int)std::distance(first, last);

	for (int i = numItems-1; i >= 1; i--)
	{
		int j = getInt(0, i);
		swap(*(first + i), *(first + j));
	}
}